

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteFloat
               (int field_number,float value,CodedOutputStream *output)

{
  uint32 uVar1;
  CodedOutputStream *output_local;
  float value_local;
  int field_number_local;
  
  uVar1 = MakeTag(field_number,WIRETYPE_FIXED32);
  io::CodedOutputStream::WriteTag(output,uVar1);
  uVar1 = EncodeFloat(value);
  io::CodedOutputStream::WriteLittleEndian32(output,uVar1);
  return;
}

Assistant:

void WireFormatLite::WriteFloat(int field_number, float value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED32, output);
  WriteFloatNoTag(value, output);
}